

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_variantSetSpecStmt
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                   *vslist,uint32_t indent)

{
  _Base_ptr p_Var1;
  long lVar2;
  string *psVar3;
  bool bVar4;
  ostream *poVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  iterator iVar8;
  _Rb_tree_node_base *p_Var9;
  uint32_t uVar10;
  size_type *psVar11;
  long lVar12;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar13;
  uint indent_00;
  const_iterator __begin4;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  primNameTable;
  token nameTok;
  stringstream ss;
  undefined1 local_278 [32];
  _Base_ptr local_258;
  size_t local_250;
  uint local_244;
  string local_240;
  long *local_220;
  long local_218;
  long local_210 [2];
  string local_200;
  _Rb_tree_node_base *local_1e0;
  string *local_1d8;
  ulong local_1d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  *local_1c8;
  _Base_ptr *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar14 = (ulong)indent;
  local_1d8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  auVar16._8_8_ = extraout_RDX;
  auVar16._0_8_ =
       *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
         **)(vslist + 0x18);
  local_1c8 = vslist + 8;
  if (*(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
        **)(vslist + 0x18) != local_1c8) {
    local_244 = indent + 1;
    indent_00 = indent + 2;
    local_1d0 = uVar14;
    do {
      p_Var9 = auVar16._0_8_;
      if (p_Var9[4]._M_parent != (_Base_ptr)0x0) {
        pprint::Indent_abi_cxx11_(&local_200,(pprint *)(uVar14 & 0xffffffff),auVar16._8_4_);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"variantSet ",0xb);
        local_220 = local_210;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"\"","");
        local_278._0_8_ = local_278 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_278,local_220,local_218 + (long)local_220);
        local_1e0 = p_Var9;
        std::__cxx11::string::_M_append(local_278,*(ulong *)(p_Var9 + 1));
        plVar6 = (long *)std::__cxx11::string::_M_append(local_278,(ulong)local_220);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_240.field_2._M_allocated_capacity = *psVar11;
          local_240.field_2._8_8_ = plVar6[3];
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        }
        else {
          local_240.field_2._M_allocated_capacity = *psVar11;
          local_240._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_240._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_240._M_dataplus._M_p,local_240._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = {\n",5);
        uVar13 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          uVar13 = extraout_RDX_01;
        }
        if (local_220 != local_210) {
          operator_delete(local_220,local_210[0] + 1);
          uVar13 = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          uVar13 = extraout_RDX_03;
        }
        uVar10 = (uint32_t)uVar13;
        auVar15._8_8_ = uVar13;
        auVar15._0_8_ = local_1e0[3]._M_right;
        local_1c0 = &local_1e0[3]._M_parent;
        if (local_1e0[3]._M_right != (_Base_ptr)local_1c0) {
          do {
            p_Var9 = auVar15._0_8_;
            pprint::Indent_abi_cxx11_(&local_200,(pprint *)(ulong)local_244,auVar15._8_4_);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
            local_220 = local_210;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"\"","");
            local_278._0_8_ = local_278 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_278,local_220,local_218 + (long)local_220);
            std::__cxx11::string::_M_append(local_278,*(ulong *)(p_Var9 + 1));
            plVar6 = (long *)std::__cxx11::string::_M_append(local_278,(ulong)local_220);
            psVar11 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_240.field_2._M_allocated_capacity = *psVar11;
              local_240.field_2._8_8_ = plVar6[3];
              local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
            }
            else {
              local_240.field_2._M_allocated_capacity = *psVar11;
              local_240._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_240._M_string_length = plVar6[1];
            *plVar6 = (long)psVar11;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
            }
            uVar10 = (uint32_t)psVar11;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_240._M_dataplus._M_p,local_240._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_220 != local_210) {
              operator_delete(local_220,local_210[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = PrimMetas::authored((PrimMetas *)&p_Var9[0xb]._M_right);
            if (bVar4) {
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
              print_prim_metas_abi_cxx11_
                        ((string *)local_278,(tinyusdz *)&p_Var9[0xb]._M_right,
                         (PrimMeta *)(ulong)indent_00,uVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_278._0_8_,
                         CONCAT44(local_278._12_4_,local_278._8_4_));
              uVar10 = extraout_EDX;
              if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
                uVar10 = extraout_EDX_00;
              }
              pprint::Indent_abi_cxx11_((string *)local_278,(pprint *)(ulong)local_244,uVar10);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1a8,(char *)local_278._0_8_,
                                  CONCAT44(local_278._12_4_,local_278._8_4_));
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
              if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{\n",2);
            print_props((string *)local_278,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         *)(p_Var9 + 5),indent_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_278._0_8_,CONCAT44(local_278._12_4_,local_278._8_4_))
            ;
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
            }
            p_Var7 = p_Var9[4]._M_parent;
            p_Var1 = p_Var9[4]._M_left;
            uVar13 = 0x882383b30d516325;
            lVar12 = ((long)p_Var1 - (long)p_Var7 >> 3) * -0x77dc7c4cf2ae9cdb;
            if (*(long *)(p_Var9 + 0x27) - (long)p_Var9[0x26]._M_right >> 5 == lVar12) {
              local_278._8_4_ = _S_red;
              local_278._16_8_ = (_Link_type)0x0;
              local_278._24_8_ = local_278 + 8;
              local_250 = 0;
              p_Var7 = p_Var9[4]._M_parent;
              local_258 = (_Base_ptr)local_278._24_8_;
              if (p_Var9[4]._M_left != p_Var7) {
                lVar12 = 0;
                uVar14 = 0;
                do {
                  local_200._M_dataplus._M_p = (pointer)((long)&p_Var7->_M_color + lVar12);
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>>
                  ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::PrimSpec_const*>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>>
                              *)local_278,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&p_Var7[1]._M_parent + lVar12),(PrimSpec **)&local_200);
                  uVar14 = uVar14 + 1;
                  p_Var7 = p_Var9[4]._M_parent;
                  lVar12 = lVar12 + 0x568;
                } while (uVar14 < (ulong)(((long)p_Var9[4]._M_left - (long)p_Var7 >> 3) *
                                         -0x77dc7c4cf2ae9cdb));
              }
              p_Var7 = p_Var9[0x26]._M_right;
              if (*(_Base_ptr *)(p_Var9 + 0x27) != p_Var7) {
                lVar12 = 8;
                uVar14 = 0;
                do {
                  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
                  lVar2 = *(long *)((long)p_Var7 + lVar12 + -8);
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_200,lVar2,
                             *(long *)((long)&p_Var7->_M_color + lVar12) + lVar2);
                  iVar8 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                                  *)local_278,&local_200);
                  if (iVar8._M_node != (_Base_ptr)(local_278 + 8)) {
                    prim::print_primspec_abi_cxx11_
                              (&local_240,*(prim **)(iVar8._M_node + 2),(PrimSpec *)(ulong)indent_00
                               ,(uint32_t)(_Base_ptr)(local_278 + 8));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_240._M_dataplus._M_p != &local_240.field_2) {
                      operator_delete(local_240._M_dataplus._M_p,
                                      local_240.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_200._M_dataplus._M_p != &local_200.field_2) {
                    operator_delete(local_200._M_dataplus._M_p,
                                    local_200.field_2._M_allocated_capacity + 1);
                  }
                  uVar14 = uVar14 + 1;
                  p_Var7 = p_Var9[0x26]._M_right;
                  lVar12 = lVar12 + 0x20;
                } while (uVar14 < (ulong)(*(long *)(p_Var9 + 0x27) - (long)p_Var7 >> 5));
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                          *)local_278,(_Link_type)local_278._16_8_);
              uVar10 = extraout_EDX_01;
            }
            else {
              for (; uVar10 = (uint32_t)uVar13, p_Var7 != p_Var1;
                  p_Var7 = (_Base_ptr)&p_Var7[0x2b]._M_parent) {
                prim::print_primspec_abi_cxx11_
                          ((string *)local_278,(prim *)p_Var7,(PrimSpec *)(ulong)indent_00,
                           (uint32_t)lVar12);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,(char *)local_278._0_8_,
                           CONCAT44(local_278._12_4_,local_278._8_4_));
                uVar13 = extraout_RDX_04;
                if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                  operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
                  uVar13 = extraout_RDX_05;
                }
              }
            }
            pprint::Indent_abi_cxx11_((string *)local_278,(pprint *)(ulong)local_244,uVar10);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,(char *)local_278._0_8_,
                                CONCAT44(local_278._12_4_,local_278._8_4_));
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
            }
            auVar15 = std::_Rb_tree_increment(p_Var9);
            uVar10 = auVar15._8_4_;
          } while ((_Base_ptr *)auVar15._0_8_ != local_1c0);
        }
        uVar14 = local_1d0;
        pprint::Indent_abi_cxx11_((string *)local_278,(pprint *)(local_1d0 & 0xffffffff),uVar10);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(char *)local_278._0_8_,
                            CONCAT44(local_278._12_4_,local_278._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
        p_Var9 = local_1e0;
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
          p_Var9 = local_1e0;
        }
      }
      auVar16 = std::_Rb_tree_increment(p_Var9);
    } while (auVar16._0_8_ != local_1c8);
  }
  psVar3 = local_1d8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string print_variantSetSpecStmt(
    const std::map<std::string, VariantSetSpec> &vslist,
    const uint32_t indent) {
  std::stringstream ss;

  // ss << "# variantSet.size = " << std::to_string(vslist.size()) << "\n";
  for (const auto &variantSet : vslist) {
    if (variantSet.second.variantSet.empty()) {
      continue;
    }

    ss << pprint::Indent(indent) << "variantSet " << quote(variantSet.first)
       << " = {\n";

    for (const auto &item : variantSet.second.variantSet) {
      ss << pprint::Indent(indent + 1) << quote(item.first) << " ";

      if (item.second.metas().authored()) {
        ss << "(\n";
        ss << print_prim_metas(item.second.metas(), indent + 2);
        ss << pprint::Indent(indent + 1) << ") ";
      }

      ss << "{\n";

      // props
      ss << print_props(item.second.props(), indent + 2);

      // primChildren
      // TODO: print child Prims based on `primChildren` Prim metadata
      const auto &variantPrimMetas = item.second.metas();
      const auto &variantPrimChildren = item.second.children();

      if (variantPrimMetas.primChildren.size() == variantPrimChildren.size()) {
        std::map<std::string, const PrimSpec *> primNameTable;
        for (size_t i = 0; i < variantPrimChildren.size(); i++) {
          primNameTable.emplace(variantPrimChildren[i].name(),
                                &variantPrimChildren[i]);
        }

        for (size_t i = 0; i < variantPrimMetas.primChildren.size(); i++) {
          value::token nameTok = variantPrimMetas.primChildren[i];
          DCOUT(fmt::format("variantPrimChildren  {}/{} = {}", i,
                            variantPrimMetas.primChildren.size(),
                            nameTok.str()));
          const auto it = primNameTable.find(nameTok.str());
          if (it != primNameTable.end()) {
            ss << prim::print_primspec(*(it->second), indent + 2);
          } else {
            // TODO: Report warning?
          }
        }
      } else {
        for (const auto &child : variantPrimChildren) {
          ss << prim::print_primspec(child, indent + 2);
        }
      }

      // ss << "# variantSet end\n";
      ss << pprint::Indent(indent + 1) << "}\n";
    }

    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}